

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::merge(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_60 [80];
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_60[0x47] = '\0';
  this_local = this;
  castable(this);
  bVar1 = match(in_RSI,Merge);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    consume(in_RSI);
    make<Merge>();
    merge((Parser *)local_60);
    make<BinaryOperator,std::shared_ptr<Merge>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
              ((shared_ptr<Merge> *)(local_60 + 0x20),(shared_ptr<Expression> *)(local_60 + 0x10),
               (shared_ptr<Expression> *)this);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_60);
    std::shared_ptr<Merge>::~shared_ptr((shared_ptr<Merge> *)(local_60 + 0x10));
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::merge() {
    ptr<Expression> expr = castable();

    if(match(TokenType::Merge)) {
        consume();
        expr = make<BinaryOperator>(make<Merge>(), expr, merge());
    }

    return expr;
}